

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BreakpointProbe.cpp
# Opt level: O0

bool __thiscall Js::BreakpointProbe::CanHalt(BreakpointProbe *this,InterpreterHaltState *pHaltState)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  int offset;
  FunctionBody *pCurrentFuncBody;
  InterpreterHaltState *pHaltState_local;
  BreakpointProbe *this_local;
  
  if (this->functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/BreakpointProbe.cpp"
                                ,0x2a,"(this->functionBody)","this->functionBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pFVar5 = InterpreterHaltState::GetFunction(pHaltState);
  iVar3 = InterpreterHaltState::GetCurrentOffset(pHaltState);
  if ((this->functionBody == pFVar5) && (this->byteOffset == iVar3)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BreakpointProbe::CanHalt(InterpreterHaltState* pHaltState)
    {
        Assert(this->functionBody);

        FunctionBody* pCurrentFuncBody = pHaltState->GetFunction();
        int offset = pHaltState->GetCurrentOffset();

        if (functionBody == pCurrentFuncBody && byteOffset == offset)
        {
            return true;
        }
        return false;
    }